

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_script.cpp
# Opt level: O3

void __thiscall
cfdcapi_script_CfdParseScript_ScriptSig_TEST_Test::TestBody
          (cfdcapi_script_CfdParseScript_ScriptSig_TEST_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  uint32_t index;
  char *pitem;
  int ret;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  void *item_handle;
  uint32_t item_num;
  void *handle;
  AssertHelper local_a0;
  AssertHelper local_98;
  int local_8c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  AssertHelper local_50;
  uint32_t local_44;
  void *local_40;
  AssertHelper local_38;
  
  local_40 = (void *)0x0;
  local_8c = CfdCreateHandle(&local_40);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_88.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_70,"kCfdSuccess","ret",(CfdErrorCode *)&local_88,&local_8c);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_88);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(((local_88.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_88.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,local_40 != (void *)0x0);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_40 == (void *)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)&local_88,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x52,(char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,
                                      (char)local_70._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p) !=
        &local_70.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p));
    }
    if (local_50.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_50.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50.data_ = (AssertHelperData *)0x0;
  local_44 = 0;
  local_8c = CfdParseScript(local_40,
                            "47304402204b922f2dafdd926b22b0e669fd774a2d5f10f969b8089a1c3a0384ba7ce95f6e02204e71c2a620cf430fa6d7ceaeb40d5298f20eebae3ecb783714a6adc03c66717d0121038f5d4ee5a661c04de7b715c6b9ac935456419fa9f484470275d1d489f2793301"
                            ,&local_50.data_,&local_44);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_88.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_70,"kCfdSuccess","ret",(CfdErrorCode *)&local_88,&local_8c);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_88);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(((local_88.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_88.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_50.data_ != (AssertHelperData *)0x0);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_50.data_ == (AssertHelperData *)0x0) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)&local_88,(AssertionResult *)"(nullptr == item_handle)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x5b,(char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,
                                      (char)local_70._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p) !=
        &local_70.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p));
    }
    if (local_a0.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_88.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_70,"2","item_num",(int *)&local_88,&local_44);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_88);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(((local_88.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_8c == 0) {
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_88,(ulong)local_44);
    if (local_44 != 0) {
      index = 0;
      do {
        local_a0.data_ = (AssertHelperData *)0x0;
        local_8c = CfdGetScriptItem(local_40,local_50.data_,index,(char **)&local_a0);
        local_98.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_70,"kCfdSuccess","ret",(CfdErrorCode *)&local_98,&local_8c);
        if ((char)local_70._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_98);
          pcVar2 = "";
          if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
            pcVar2 = *(char **)local_70._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                     ,100,pcVar2);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if (CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) != 0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               ((long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_70._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        std::__cxx11::string::string
                  ((string *)&local_70,(char *)local_a0.data_,(allocator *)&local_98);
        CfdFreeStringBuffer((char *)local_a0.data_);
        if (local_8c == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_88,&local_70);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p) !=
            &local_70.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p))
          ;
        }
        index = index + 1;
      } while (index < local_44);
    }
    if ((long)local_88.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_88.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_70,"script_items.at(0).c_str()",
                 "\"304402204b922f2dafdd926b22b0e669fd774a2d5f10f969b8089a1c3a0384ba7ce95f6e02204e71c2a620cf430fa6d7ceaeb40d5298f20eebae3ecb783714a6adc03c66717d01\""
                 ,((local_88.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                 "304402204b922f2dafdd926b22b0e669fd774a2d5f10f969b8089a1c3a0384ba7ce95f6e02204e71c2a620cf430fa6d7ceaeb40d5298f20eebae3ecb783714a6adc03c66717d01"
                );
      if ((char)local_70._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a0);
        if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_70._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x6d,pcVar2);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_a0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_70._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if ((ulong)((long)local_88.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_88.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
      }
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_70,"script_items.at(1).c_str()",
                 "\"038f5d4ee5a661c04de7b715c6b9ac935456419fa9f484470275d1d489f2793301\"",
                 local_88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                 "038f5d4ee5a661c04de7b715c6b9ac935456419fa9f484470275d1d489f2793301");
      if ((char)local_70._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a0);
        if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_70._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x6e,pcVar2);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_a0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_70._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
  }
  local_8c = CfdFreeScriptItemHandle(local_40,local_50.data_);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_88.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_70,"kCfdSuccess","ret",(CfdErrorCode *)&local_88,&local_8c);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_88);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(((local_88.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8c = CfdGetLastErrorCode(local_40);
  if (local_8c != 0) {
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_8c = CfdGetLastErrorMessage(local_40,(char **)&local_88);
    local_a0.data_ = local_a0.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_70,"kCfdSuccess","ret",(CfdErrorCode *)&local_a0,&local_8c);
    if ((char)local_70._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_a0);
      if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_70._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x78,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_a0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_a0.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_70._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_70,"\"\"","str_buffer","",
               (char *)local_88.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if ((char)local_70._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_a0);
      if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_70._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x79,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_a0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_a0.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_70._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)local_88.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  }
  local_8c = CfdFreeHandle(local_40);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_88.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_70,"kCfdSuccess","ret",(CfdErrorCode *)&local_88,&local_8c);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_88);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(((local_88.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cfdcapi_script, CfdParseScript_ScriptSig_TEST) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  // <signature(304402204b922f2dafdd926b22b0e669fd774a2d5f10f969b8089a1c3a0384ba7ce95f6e02204e71c2a620cf430fa6d7ceaeb40d5298f20eebae3ecb783714a6adc03c66717d[ALL])> <pubkey(038f5d4ee5a661c04de7b715c6b9ac935456419fa9f484470275d1d489f2793301)>
  const char* unlocking_script = "47304402204b922f2dafdd926b22b0e669fd774a2d5f10f969b8089a1c3a0384ba7ce95f6e02204e71c2a620cf430fa6d7ceaeb40d5298f20eebae3ecb783714a6adc03c66717d0121038f5d4ee5a661c04de7b715c6b9ac935456419fa9f484470275d1d489f2793301";
  void* item_handle = nullptr;
  uint32_t item_num = 0;

  ret = CfdParseScript(handle, unlocking_script, &item_handle, &item_num);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((nullptr == item_handle));
  EXPECT_EQ(2, item_num);

  if (ret == kCfdSuccess) {
    std::vector<std::string> script_items;
    script_items.reserve(item_num);
    for (uint32_t i = 0; i < item_num; ++i) {
      char* pitem = nullptr;
      ret = CfdGetScriptItem(handle, item_handle, i, &pitem);
      EXPECT_EQ(kCfdSuccess, ret);
      std::string item(pitem);
      CfdFreeStringBuffer(pitem);
      if (ret == kCfdSuccess) {
        script_items.push_back(item);
      }
    }

    if (script_items.size() == 2) {
      EXPECT_STREQ(script_items.at(0).c_str(), "304402204b922f2dafdd926b22b0e669fd774a2d5f10f969b8089a1c3a0384ba7ce95f6e02204e71c2a620cf430fa6d7ceaeb40d5298f20eebae3ecb783714a6adc03c66717d01");
      EXPECT_STREQ(script_items.at(1).c_str(), "038f5d4ee5a661c04de7b715c6b9ac935456419fa9f484470275d1d489f2793301");
    }
  }
  ret = CfdFreeScriptItemHandle(handle, item_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}